

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastHex32ToBuffer(uint32 value,char *buffer)

{
  char *pcVar1;
  char *buffer_local;
  uint32 value_local;
  
  pcVar1 = InternalFastHexToBuffer((ulong)value,buffer,8);
  return pcVar1;
}

Assistant:

char *FastHex32ToBuffer(uint32 value, char* buffer) {
  return InternalFastHexToBuffer(value, buffer, 8);
}